

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O0

void facemap_scanner(map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                     *faces_map,int *face_map_index,face_properties *current_face)

{
  int iVar1;
  iterator face_in_question;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  pair<int,_face_properties> local_90;
  pair<int,_face_properties> local_68;
  _Base_ptr local_50;
  _Base_ptr local_48;
  int local_3c;
  iterator iStack_38;
  int n;
  byte local_2a;
  undefined1 local_29;
  bool current_face_has_been_added;
  iterator iStack_28;
  bool face_already_exists;
  iterator face_map_searcher_iterator;
  face_properties *current_face_local;
  int *face_map_index_local;
  map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
  *faces_map_local;
  
  face_map_searcher_iterator._M_node = (_Base_ptr)current_face;
  iStack_28 = std::
              map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
              ::begin(faces_map);
  local_29 = 0;
  local_2a = 0;
  bVar2 = std::
          map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
          ::empty(faces_map);
  if (bVar2) {
    *face_map_index = *face_map_index + 1;
    std::pair<int,_face_properties>::pair<int_&,_face_properties_&,_true>
              (&local_90,face_map_index,(face_properties *)face_map_searcher_iterator._M_node);
    std::
    map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>::
    insert<std::pair<int,face_properties>>
              ((map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
                *)faces_map,&local_90);
  }
  else {
    while( true ) {
      iStack_38 = std::
                  map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                  ::end(faces_map);
      bVar2 = std::operator!=(&stack0xffffffffffffffd8,&stack0xffffffffffffffc8);
      face_in_question = face_map_searcher_iterator;
      if (!bVar2) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                         (&stack0xffffffffffffffd8);
      local_29 = compare_faces((face_properties *)face_in_question._M_node,&ppVar3->second);
      if ((bool)local_29) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                           (&stack0xffffffffffffffd8);
        if ((ppVar3->second).parent_materials[0] ==
            *(int *)((long)&(face_map_searcher_iterator._M_node)->_M_parent + 4)) {
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          (ppVar3->second).face_type = 3;
          iVar1 = *(int *)((long)&(face_map_searcher_iterator._M_node)->_M_parent + 4);
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          (ppVar3->second).parent_materials[1] = iVar1;
        }
        else {
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          (ppVar3->second).face_type = 2;
          iVar1 = *(int *)((long)&(face_map_searcher_iterator._M_node)->_M_parent + 4);
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          (ppVar3->second).parent_materials[1] = iVar1;
          local_3c = 2;
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                             (&stack0xffffffffffffffd8);
          std::sort<int*>((ppVar3->second).parent_materials,
                          (ppVar4->second).parent_materials + local_3c);
        }
        local_2a = 1;
        local_48 = (_Base_ptr)
                   std::
                   map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                   ::end(faces_map);
        iStack_28 = (iterator)local_48;
      }
      else {
        local_50 = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator++
                             (&stack0xffffffffffffffd8,0);
      }
    }
    if ((local_2a & 1) == 0) {
      *face_map_index = *face_map_index + 1;
      std::pair<int,_face_properties>::pair<int_&,_face_properties_&,_true>
                (&local_68,face_map_index,(face_properties *)face_map_searcher_iterator._M_node);
      std::
      map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>::
      insert<std::pair<int,face_properties>>
                ((map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
                  *)faces_map,&local_68);
    }
  }
  return;
}

Assistant:

void facemap_scanner(std::map<int, face_properties> &faces_map, int &face_map_index, face_properties &current_face)
{
    std::map<int, face_properties>::iterator face_map_searcher_iterator = faces_map.begin();
    bool face_already_exists = false;
    bool current_face_has_been_added = false;
    if (faces_map.empty() == false)
    {
        while (face_map_searcher_iterator != faces_map.end())
        {
            face_already_exists = compare_faces(current_face, face_map_searcher_iterator->second);
            if (face_already_exists == true) //update face data to change type and append parent materials
            {
                // if parent materials match -> make insider
                if (face_map_searcher_iterator->second.parent_materials[0] == current_face.parent_materials[0])
                {
                    face_map_searcher_iterator->second.face_type = 3; //face=insider
                    face_map_searcher_iterator->second.parent_materials[1] = current_face.parent_materials[0];
                }
                // if parent materials don't match -> make interface and add the second reference material
                else
                {
                    face_map_searcher_iterator->second.face_type = 2; //face=interface
                    face_map_searcher_iterator->second.parent_materials[1] = current_face.parent_materials[0];
                    int n = sizeof(face_map_searcher_iterator->second.parent_materials) / sizeof(face_map_searcher_iterator->second.parent_materials[0]);
                    std::sort(face_map_searcher_iterator->second.parent_materials, face_map_searcher_iterator->second.parent_materials + n);
                }
                current_face_has_been_added = true;
                face_map_searcher_iterator = faces_map.end(); //break from the loop as we have found the second and only face.
            }
            else
            {
                face_map_searcher_iterator++;
            }
        }
        if (current_face_has_been_added == false) // Add the element as no previous reference was found.
        {
            faces_map.insert(std::pair<int, face_properties>(++face_map_index, current_face));
        }

    }
    else // Add the element as there can't possibly be one already.
    {
        faces_map.insert(std::pair<int, face_properties>(++face_map_index, current_face));
    }
}